

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-udp-connect.c
# Opt level: O0

int run_test_udp_connect(void)

{
  int iVar1;
  uv_loop_t *puVar2;
  uv_buf_t uVar3;
  int64_t eval_b_29;
  int64_t eval_a_29;
  int64_t eval_b_28;
  int64_t eval_a_28;
  int64_t eval_b_27;
  int64_t eval_a_27;
  int64_t eval_b_26;
  int64_t eval_a_26;
  int64_t eval_b_25;
  int64_t eval_a_25;
  int64_t eval_b_24;
  int64_t eval_a_24;
  int64_t eval_b_23;
  int64_t eval_a_23;
  int64_t eval_b_22;
  int64_t eval_a_22;
  int64_t eval_b_21;
  int64_t eval_a_21;
  int64_t eval_b_20;
  int64_t eval_a_20;
  int64_t eval_b_19;
  int64_t eval_a_19;
  int64_t eval_b_18;
  int64_t eval_a_18;
  int64_t eval_b_17;
  int64_t eval_a_17;
  int64_t eval_b_16;
  int64_t eval_a_16;
  int64_t eval_b_15;
  int64_t eval_a_15;
  int64_t eval_b_14;
  int64_t eval_a_14;
  int64_t eval_b_13;
  int64_t eval_a_13;
  int64_t eval_b_12;
  int64_t eval_a_12;
  int64_t eval_b_11;
  int64_t eval_a_11;
  int64_t eval_b_10;
  int64_t eval_a_10;
  int64_t eval_b_9;
  int64_t eval_a_9;
  int64_t eval_b_8;
  int64_t eval_a_8;
  int64_t eval_b_7;
  int64_t eval_a_7;
  int64_t eval_b_6;
  int64_t eval_a_6;
  int64_t eval_b_5;
  int64_t eval_a_5;
  size_t local_1d8;
  int64_t eval_b_4;
  int64_t eval_a_4;
  int64_t eval_b_3;
  int64_t eval_a_3;
  int64_t eval_b_2;
  int64_t eval_a_2;
  int64_t eval_b_1;
  int64_t eval_a_1;
  int64_t eval_b;
  int64_t eval_a;
  int addrlen;
  int r;
  sockaddr_in tmp_addr;
  sockaddr_in ext_addr;
  uv_udp_send_t req;
  
  iVar1 = uv_ip4_addr("0.0.0.0",0x23a3,&lo_addr);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-udp-connect.c"
            ,0x6e,"uv_ip4_addr(\"0.0.0.0\", 9123, &lo_addr)","==","0",(long)iVar1,"==",0);
    abort();
  }
  puVar2 = uv_default_loop();
  eval_a._4_4_ = uv_udp_init(puVar2,&server);
  if ((long)eval_a._4_4_ != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-udp-connect.c"
            ,0x71,"r","==","0",(long)eval_a._4_4_,"==",0);
    abort();
  }
  eval_a._4_4_ = uv_udp_bind(&server,(sockaddr *)&lo_addr,0);
  if ((long)eval_a._4_4_ != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-udp-connect.c"
            ,0x74,"r","==","0",(long)eval_a._4_4_,"==",0);
    abort();
  }
  eval_a._4_4_ = uv_udp_recv_start(&server,alloc_cb,sv_recv_cb);
  if ((long)eval_a._4_4_ != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-udp-connect.c"
            ,0x77,"r","==","0",(long)eval_a._4_4_,"==",0);
    abort();
  }
  puVar2 = uv_default_loop();
  eval_a._4_4_ = uv_udp_init(puVar2,&client);
  if ((long)eval_a._4_4_ != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-udp-connect.c"
            ,0x7a,"r","==","0",(long)eval_a._4_4_,"==",0);
    abort();
  }
  uVar3 = uv_buf_init("EXIT",4);
  eval_a_5 = (int64_t)uVar3.base;
  buf.base = (char *)eval_a_5;
  local_1d8 = uVar3.len;
  buf.len = local_1d8;
  iVar1 = uv_ip4_addr("0.0.0.0",0x23a3,(sockaddr_in *)&addrlen);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-udp-connect.c"
            ,0x7f,"uv_ip4_addr(\"0.0.0.0\", 9123, &tmp_addr)","==","0",(long)iVar1,"==",0);
    abort();
  }
  eval_a._4_4_ = uv_udp_connect(&client,(sockaddr *)&addrlen);
  if ((long)eval_a._4_4_ != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-udp-connect.c"
            ,0x84,"r","==","0",(long)eval_a._4_4_,"==",0);
    abort();
  }
  eval_a._4_4_ = uv_udp_connect(&client,(sockaddr *)0x0);
  if ((long)eval_a._4_4_ != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-udp-connect.c"
            ,0x86,"r","==","0",(long)eval_a._4_4_,"==",0);
    abort();
  }
  iVar1 = uv_ip4_addr("8.8.8.8",0x23a3,(sockaddr_in *)tmp_addr.sin_zero);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-udp-connect.c"
            ,0x89,"uv_ip4_addr(\"8.8.8.8\", 9123, &ext_addr)","==","0",(long)iVar1,"==",0);
    abort();
  }
  iVar1 = uv_ip4_addr("127.0.0.1",0x23a3,&lo_addr);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-udp-connect.c"
            ,0x8a,"uv_ip4_addr(\"127.0.0.1\", 9123, &lo_addr)","==","0",(long)iVar1,"==",0);
    abort();
  }
  eval_a._4_4_ = uv_udp_connect(&client,(sockaddr *)&lo_addr);
  if ((long)eval_a._4_4_ != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-udp-connect.c"
            ,0x8d,"r","==","0",(long)eval_a._4_4_,"==",0);
    abort();
  }
  eval_a._4_4_ = uv_udp_connect(&client,(sockaddr *)tmp_addr.sin_zero);
  if ((long)eval_a._4_4_ != -0x6a) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-udp-connect.c"
            ,0x8f,"r","==","UV_EISCONN",(long)eval_a._4_4_,"==",0xffffffffffffff96);
    abort();
  }
  eval_a._0_4_ = 0x10;
  eval_a._4_4_ = uv_udp_getpeername(&client,(sockaddr *)&addrlen,(int *)&eval_a);
  if ((long)eval_a._4_4_ != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-udp-connect.c"
            ,0x93,"r","==","0",(long)eval_a._4_4_,"==",0);
    abort();
  }
  eval_a._4_4_ = uv_udp_try_send(&client,&buf,1,(sockaddr *)&lo_addr);
  if ((long)eval_a._4_4_ != -0x6a) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-udp-connect.c"
            ,0x97,"r","==","UV_EISCONN",(long)eval_a._4_4_,"==",0xffffffffffffff96);
    abort();
  }
  eval_a._4_4_ = uv_udp_try_send(&client,&buf,1,(sockaddr *)0x0);
  if ((long)eval_a._4_4_ != 4) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-udp-connect.c"
            ,0x99,"4","==","r",4,"==",(long)eval_a._4_4_);
    abort();
  }
  eval_a._4_4_ = uv_udp_try_send(&client,&buf,1,(sockaddr *)tmp_addr.sin_zero);
  if ((long)eval_a._4_4_ != -0x6a) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-udp-connect.c"
            ,0x9b,"r","==","UV_EISCONN",(long)eval_a._4_4_,"==",0xffffffffffffff96);
    abort();
  }
  eval_a._4_4_ = uv_udp_connect(&client,(sockaddr *)0x0);
  if ((long)eval_a._4_4_ != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-udp-connect.c"
            ,0x9e,"r","==","0",(long)eval_a._4_4_,"==",0);
    abort();
  }
  eval_a._4_4_ = uv_udp_connect(&client,(sockaddr *)0x0);
  if ((long)eval_a._4_4_ != -0x6b) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-udp-connect.c"
            ,0xa0,"r","==","UV_ENOTCONN",(long)eval_a._4_4_,"==",0xffffffffffffff95);
    abort();
  }
  eval_a._0_4_ = 0x10;
  eval_a._4_4_ = uv_udp_getpeername(&client,(sockaddr *)&addrlen,(int *)&eval_a);
  if ((long)eval_a._4_4_ != -0x6b) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-udp-connect.c"
            ,0xa4,"r","==","UV_ENOTCONN",(long)eval_a._4_4_,"==",0xffffffffffffff95);
    abort();
  }
  eval_a._4_4_ = uv_udp_try_send(&client,&buf,1,(sockaddr *)&lo_addr);
  if ((long)eval_a._4_4_ != 4) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-udp-connect.c"
            ,0xa8,"4","==","r",4,"==",(long)eval_a._4_4_);
    abort();
  }
  eval_a._4_4_ = uv_udp_try_send(&client,&buf,1,(sockaddr *)0x0);
  if ((long)eval_a._4_4_ != -0x59) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-udp-connect.c"
            ,0xaa,"r","==","UV_EDESTADDRREQ",(long)eval_a._4_4_,"==",0xffffffffffffffa7);
    abort();
  }
  eval_a._4_4_ = uv_udp_connect(&client,(sockaddr *)&lo_addr);
  if ((long)eval_a._4_4_ != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-udp-connect.c"
            ,0xae,"r","==","0",(long)eval_a._4_4_,"==",0);
    abort();
  }
  eval_a._4_4_ = uv_udp_send((uv_udp_send_t *)ext_addr.sin_zero,&client,&buf,1,(sockaddr *)&lo_addr,
                             cl_send_cb);
  if ((long)eval_a._4_4_ != -0x6a) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-udp-connect.c"
            ,0xb5,"r","==","UV_EISCONN",(long)eval_a._4_4_,"==",0xffffffffffffff96);
    abort();
  }
  eval_a._4_4_ = uv_udp_send((uv_udp_send_t *)ext_addr.sin_zero,&client,&buf,1,(sockaddr *)0x0,
                             cl_send_cb);
  if ((long)eval_a._4_4_ != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-udp-connect.c"
            ,0xb7,"r","==","0",(long)eval_a._4_4_,"==",0);
    abort();
  }
  puVar2 = uv_default_loop();
  uv_run(puVar2,UV_RUN_DEFAULT);
  if ((long)close_cb_called != 2) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-udp-connect.c"
            ,0xbb,"2","==","close_cb_called",2,"==",(long)close_cb_called);
    abort();
  }
  if ((long)sv_recv_cb_called != 4) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-udp-connect.c"
            ,0xbc,"4","==","sv_recv_cb_called",4,"==",(long)sv_recv_cb_called);
    abort();
  }
  if ((long)cl_send_cb_called != 2) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-udp-connect.c"
            ,0xbd,"2","==","cl_send_cb_called",2,"==",(long)cl_send_cb_called);
    abort();
  }
  if (client.send_queue_size != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-udp-connect.c"
            ,0xbf,"client.send_queue_size","==","0",client.send_queue_size,"==",0);
    abort();
  }
  if (server.send_queue_size != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-udp-connect.c"
            ,0xc0,"server.send_queue_size","==","0",server.send_queue_size,"==",0);
    abort();
  }
  puVar2 = uv_default_loop();
  close_loop(puVar2);
  puVar2 = uv_default_loop();
  iVar1 = uv_loop_close(puVar2);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-udp-connect.c"
            ,0xc2,"0","==","uv_loop_close(uv_default_loop())",0,"==",(long)iVar1);
    abort();
  }
  uv_library_shutdown();
  return 0;
}

Assistant:

TEST_IMPL(udp_connect) {
#if defined(__OpenBSD__)
  RETURN_SKIP("Test does not currently work in OpenBSD");
#endif
  uv_udp_send_t req;
  struct sockaddr_in ext_addr;
  struct sockaddr_in tmp_addr;
  int r;
  int addrlen;

  ASSERT_OK(uv_ip4_addr("0.0.0.0", TEST_PORT, &lo_addr));

  r = uv_udp_init(uv_default_loop(), &server);
  ASSERT_OK(r);

  r = uv_udp_bind(&server, (const struct sockaddr*) &lo_addr, 0);
  ASSERT_OK(r);

  r = uv_udp_recv_start(&server, alloc_cb, sv_recv_cb);
  ASSERT_OK(r);

  r = uv_udp_init(uv_default_loop(), &client);
  ASSERT_OK(r);

  buf = uv_buf_init("EXIT", 4);

  /* connect() to INADDR_ANY fails on Windows with WSAEADDRNOTAVAIL */
  ASSERT_OK(uv_ip4_addr("0.0.0.0", TEST_PORT, &tmp_addr));
  r = uv_udp_connect(&client, (const struct sockaddr*) &tmp_addr);
#ifdef _WIN32
  ASSERT_EQ(r, UV_EADDRNOTAVAIL);
#else
  ASSERT_OK(r);
  r = uv_udp_connect(&client, NULL);
  ASSERT_OK(r);
#endif

  ASSERT_OK(uv_ip4_addr("8.8.8.8", TEST_PORT, &ext_addr));
  ASSERT_OK(uv_ip4_addr("127.0.0.1", TEST_PORT, &lo_addr));

  r = uv_udp_connect(&client, (const struct sockaddr*) &lo_addr);
  ASSERT_OK(r);
  r = uv_udp_connect(&client, (const struct sockaddr*) &ext_addr);
  ASSERT_EQ(r, UV_EISCONN);

  addrlen = sizeof(tmp_addr);
  r = uv_udp_getpeername(&client, (struct sockaddr*) &tmp_addr, &addrlen);
  ASSERT_OK(r);

  /* To send messages in connected UDP sockets addr must be NULL */
  r = uv_udp_try_send(&client, &buf, 1, (const struct sockaddr*) &lo_addr);
  ASSERT_EQ(r, UV_EISCONN);
  r = uv_udp_try_send(&client, &buf, 1, NULL);
  ASSERT_EQ(4, r);
  r = uv_udp_try_send(&client, &buf, 1, (const struct sockaddr*) &ext_addr);
  ASSERT_EQ(r, UV_EISCONN);

  r = uv_udp_connect(&client, NULL);
  ASSERT_OK(r);
  r = uv_udp_connect(&client, NULL);
  ASSERT_EQ(r, UV_ENOTCONN);

  addrlen = sizeof(tmp_addr);
  r = uv_udp_getpeername(&client, (struct sockaddr*) &tmp_addr, &addrlen);
  ASSERT_EQ(r, UV_ENOTCONN);

  /* To send messages in disconnected UDP sockets addr must be set */
  r = uv_udp_try_send(&client, &buf, 1, (const struct sockaddr*) &lo_addr);
  ASSERT_EQ(4, r);
  r = uv_udp_try_send(&client, &buf, 1, NULL);
  ASSERT_EQ(r, UV_EDESTADDRREQ);


  r = uv_udp_connect(&client, (const struct sockaddr*) &lo_addr);
  ASSERT_OK(r);
  r = uv_udp_send(&req,
                  &client,
                  &buf,
                  1,
                  (const struct sockaddr*) &lo_addr,
                  cl_send_cb);
  ASSERT_EQ(r, UV_EISCONN);
  r = uv_udp_send(&req, &client, &buf, 1, NULL, cl_send_cb);
  ASSERT_OK(r);

  uv_run(uv_default_loop(), UV_RUN_DEFAULT);

  ASSERT_EQ(2, close_cb_called);
  ASSERT_EQ(4, sv_recv_cb_called);
  ASSERT_EQ(2, cl_send_cb_called);

  ASSERT_OK(client.send_queue_size);
  ASSERT_OK(server.send_queue_size);

  MAKE_VALGRIND_HAPPY(uv_default_loop());
  return 0;
}